

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O2

void spirv_cross::ParsedIR::sanitize_identifier
               (string *name,bool member,bool allow_reserved_prefixes)

{
  byte bVar1;
  bool bVar2;
  size_type sVar3;
  char *__lhs;
  string local_40;
  
  bVar2 = is_valid_identifier(name);
  if (!bVar2) {
    ::std::__cxx11::string::find((char)name,0x28);
    ::std::__cxx11::string::substr((ulong)&local_40,(ulong)name);
    if (local_40._M_string_length != 0) {
      if ((byte)(*local_40._M_dataplus._M_p - 0x30U) < 10) {
        *local_40._M_dataplus._M_p = '_';
      }
      for (sVar3 = 0; local_40._M_string_length != sVar3; sVar3 = sVar3 + 1) {
        bVar1 = local_40._M_dataplus._M_p[sVar3];
        if (((bVar1 != 0x5f) && (9 < (byte)(bVar1 - 0x30))) &&
           (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) {
          local_40._M_dataplus._M_p[sVar3] = '_';
        }
      }
      sanitize_underscores(&local_40);
    }
    ::std::__cxx11::string::operator=((string *)name,(string *)&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  bVar2 = is_reserved_identifier(name,member,allow_reserved_prefixes);
  if (bVar2) {
    bVar2 = is_reserved_prefix(name);
    __lhs = "_RESERVED_IDENTIFIER_FIXUP";
    if (bVar2) {
      __lhs = "_RESERVED_IDENTIFIER_FIXUP_";
    }
    ::std::operator+(&local_40,__lhs,name);
    ::std::__cxx11::string::operator=((string *)name,(string *)&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void ParsedIR::sanitize_identifier(std::string &name, bool member, bool allow_reserved_prefixes)
{
	if (!is_valid_identifier(name))
		name = ensure_valid_identifier(name);
	if (is_reserved_identifier(name, member, allow_reserved_prefixes))
		name = make_unreserved_identifier(name);
}